

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecUnary(Parser *this)

{
  pointer pcVar1;
  TokenType TVar2;
  ulong uVar3;
  CompileContext *pCVar4;
  Parser *in_RSI;
  optional<enact::Token> permission;
  optional<enact::Token> region;
  Token oper;
  undefined1 local_d0 [8];
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  bool local_98;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> local_90;
  undefined1 local_88 [48];
  bool local_58;
  undefined1 local_50 [24];
  undefined1 local_38 [24];
  
  uVar3 = (ulong)(in_RSI->m_current).type;
  if (uVar3 < 0x3b) {
    if ((0x4000000000c1000U >> (uVar3 & 0x3f) & 1) != 0) {
      advance(in_RSI);
      local_c8._0_4_ = (in_RSI->m_previous).type;
      pcVar1 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
      local_c8._8_8_ = local_b8[0]._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_c8 + 8),pcVar1,
                 pcVar1 + (in_RSI->m_previous).lexeme._M_string_length);
      local_b8[1]._12_2_ = (in_RSI->m_previous).col;
      local_b8[1]._8_4_ = (in_RSI->m_previous).line;
      parsePrecUnary((Parser *)local_88);
      pCVar4 = (CompileContext *)operator_new(0x40);
      if ((char *)local_c8._8_8_ == local_b8[0]._M_local_buf + 8) {
        (pCVar4->m_source)._M_dataplus._M_p = (pointer)&PTR__UnaryExpr_001275b8;
        (pCVar4->m_source)._M_string_length = local_88._0_8_;
        *(undefined4 *)&(pCVar4->m_source).field_2 = local_c8._0_4_;
        *(size_type **)((long)&(pCVar4->m_source).field_2 + 8) =
             &(pCVar4->m_options).m_filename._M_string_length;
        (pCVar4->m_options).m_filename._M_string_length = local_b8[0]._8_8_;
        (pCVar4->m_options).m_filename.field_2._M_allocated_capacity = local_b8[1]._0_8_;
      }
      else {
        (pCVar4->m_source)._M_dataplus._M_p = (pointer)&PTR__UnaryExpr_001275b8;
        (pCVar4->m_source)._M_string_length = local_88._0_8_;
        *(undefined4 *)&(pCVar4->m_source).field_2 = local_c8._0_4_;
        ((_Alloc_hider *)((long)&(pCVar4->m_source).field_2 + 8))->_M_p = (pointer)local_c8._8_8_;
        (pCVar4->m_options).m_filename._M_string_length = local_b8[0]._8_8_;
      }
      (pCVar4->m_options).m_filename._M_dataplus._M_p = (pointer)local_b8[0]._0_8_;
      *(undefined4 *)((long)&(pCVar4->m_options).m_filename.field_2 + 8) = local_b8[1]._8_4_;
      *(undefined2 *)((long)&(pCVar4->m_options).m_filename.field_2 + 0xc) = local_b8[1]._12_2_;
      this->m_context = pCVar4;
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
    if (uVar3 == 6) {
      advance(in_RSI);
      local_50._0_4_ = (in_RSI->m_previous).type;
      pcVar1 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
      local_50._8_8_ = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_50 + 8),pcVar1,
                 pcVar1 + (in_RSI->m_previous).lexeme._M_string_length);
      local_38._20_2_ = (in_RSI->m_previous).col;
      local_38._16_4_ = (in_RSI->m_previous).line;
      local_98 = false;
      TVar2 = (in_RSI->m_current).type;
      if ((TVar2 == MUT) || (TVar2 == IMM)) {
        advance(in_RSI);
        std::optional<enact::Token>::operator=
                  ((optional<enact::Token> *)local_c8,&in_RSI->m_previous);
        TVar2 = (in_RSI->m_current).type;
      }
      local_58 = false;
      if ((TVar2 < STRUCT) && ((0xa002000000000000U >> ((ulong)TVar2 & 0x3f) & 1) != 0)) {
        advance(in_RSI);
        std::optional<enact::Token>::operator=
                  ((optional<enact::Token> *)local_88,&in_RSI->m_previous);
      }
      parsePrecUnary((Parser *)local_d0);
      std::
      make_unique<enact::ReferenceExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token,std::optional<enact::Token>,std::optional<enact::Token>>
                (&local_90,(Token *)local_d0,(optional<enact::Token> *)local_50,
                 (optional<enact::Token> *)local_c8);
      this->m_context =
           (CompileContext *)
           local_90._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
           super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
      if (local_d0 != (undefined1  [8])0x0) {
        (**(code **)((((string *)local_d0)->_M_dataplus)._M_p + 8))();
      }
      if ((local_58 == true) && (local_58 = false, (undefined1 *)local_88._8_8_ != local_88 + 0x18))
      {
        operator_delete((void *)local_88._8_8_,local_88._24_8_ + 1);
      }
      if ((local_98 == true) &&
         (local_98 = false, (char *)local_c8._8_8_ != local_b8[0]._M_local_buf + 8)) {
        operator_delete((void *)local_c8._8_8_,local_b8[0]._8_8_ + 1);
      }
      if ((undefined1 *)local_50._8_8_ == local_38) {
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      operator_delete((void *)local_50._8_8_,local_38._0_8_ + 1);
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
  }
  parsePrecCall(this);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecUnary() {
        if (consume(TokenType::MINUS) ||
            consume(TokenType::TILDE) ||
            consume(TokenType::STAR) ||
            consume(TokenType::NOT)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> expr = parsePrecUnary(); // Right recursion
            return std::make_unique<UnaryExpr>(std::move(expr), std::move(oper));
        }

        if (consume(TokenType::AMPERSAND)) {
            Token oper = m_previous;

            std::optional<Token> permission;
            if (consume(TokenType::MUT) || consume(TokenType::IMM)) {
                permission = m_previous;
            }

            std::optional<Token> region;
            if (consume(TokenType::SO) || consume(TokenType::RC) || consume(TokenType::GC)) {
                region = m_previous;
            }

            std::unique_ptr<Expr> expr = parsePrecUnary(); // Right recursion

            return std::make_unique<ReferenceExpr>(
                    std::move(expr),
                    std::move(oper),
                    std::move(permission),
                    std::move(region));
        }

        return parsePrecCall();
    }